

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_2::SampleAverageVerifier::logInfo
          (SampleAverageVerifier *this,TestLog *log)

{
  ostringstream *this_00;
  MessageBuilder *this_01;
  MessageBuilder local_190;
  
  this_00 = &local_190.m_str;
  local_190.m_log = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,
                  "Expecting average sample position to be near the pixel center. Maximum per-axis distance "
                 );
  this_01 = tcu::MessageBuilder::operator<<(&local_190,&this->m_distanceThreshold);
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  return;
}

Assistant:

void SampleAverageVerifier::logInfo (tcu::TestLog& log) const
{
	log << tcu::TestLog::Message << "Expecting average sample position to be near the pixel center. Maximum per-axis distance " << m_distanceThreshold << tcu::TestLog::EndMessage;
}